

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.cpp
# Opt level: O3

void __thiscall duckdb::ProgressBar::Update(ProgressBar *this,bool final)

{
  bool bVar1;
  idx_t iVar2;
  pointer pPVar3;
  undefined7 in_register_00000031;
  double dVar4;
  ProgressData progress;
  ProgressData local_48;
  double local_28;
  undefined8 uStack_20;
  
  if (((int)CONCAT71(in_register_00000031,final) != 0) || (this->supported == true)) {
    local_48.done = 0.0;
    local_48.total = 0.0;
    local_48.invalid = false;
    iVar2 = Executor::GetPipelinesProgress(this->executor,&local_48);
    dVar4 = 0.0;
    if (iVar2 == 0) {
      if ((((local_48.invalid == false) && (0.0 <= local_48.done)) &&
          (local_48.done <= local_48.total)) && (0.0 <= local_48.total)) {
        if (1e+15 < local_48.total) {
          local_48.done = (local_48.done / local_48.total) * 1e+15;
          local_48.total = 1e+15;
        }
        LOCK();
        (this->query_progress).rows_processed.super___atomic_base<unsigned_long>._M_i =
             (long)local_48.done >> 0x3f & (long)(local_48.done - 9.223372036854776e+18) |
             (long)local_48.done;
        UNLOCK();
        LOCK();
        (this->query_progress).total_rows_to_process.super___atomic_base<unsigned_long>._M_i =
             (long)local_48.total >> 0x3f & (long)(local_48.total - 9.223372036854776e+18) |
             (long)local_48.total;
        UNLOCK();
        dVar4 = (local_48.done / local_48.total) * 100.0;
      }
    }
    else if (!final) {
      return;
    }
    if ((this->query_progress).percentage._M_i < dVar4) {
      LOCK();
      (this->query_progress).percentage._M_i = dVar4;
      UNLOCK();
    }
    bVar1 = ShouldPrint(this,final);
    if (bVar1) {
      if (final) {
        FinishProgressBarPrint(this);
      }
      else {
        local_28 = (this->query_progress).percentage._M_i;
        uStack_20 = 0;
        pPVar3 = unique_ptr<duckdb::ProgressBarDisplay,_std::default_delete<duckdb::ProgressBarDisplay>,_true>
                 ::operator->(&this->display);
        (*pPVar3->_vptr_ProgressBarDisplay[2])(SUB84((double)(int)local_28,0),pPVar3);
      }
    }
  }
  return;
}

Assistant:

void ProgressBar::Update(bool final) {
	if (!final && !supported) {
		return;
	}

	ProgressData progress;
	idx_t invalid_pipelines = executor.GetPipelinesProgress(progress);

	double new_percentage = 0.0;
	if (invalid_pipelines == 0 && progress.IsValid()) {
		if (progress.total > 1e15) {
			progress.Normalize(1e15);
		}
		query_progress.rows_processed = idx_t(progress.done);
		query_progress.total_rows_to_process = idx_t(progress.total);
		new_percentage = progress.ProgressDone() * 100;
	}

	if (!final && invalid_pipelines > 0) {
		return;
	}

	if (new_percentage > query_progress.percentage) {
		query_progress.percentage = new_percentage;
	}
	if (ShouldPrint(final)) {
		if (final) {
			FinishProgressBarPrint();
		} else {
			PrintProgress(LossyNumericCast<int>(query_progress.percentage.load()));
		}
	}
}